

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_test.cpp
# Opt level: O1

void unary_test<viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>>
               (rt_unary_expr<viennamath::rt_expression_interface<double>_> *e,double ref_solution)

{
  ostream *poVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  numeric_type nVar2;
  vector<double,_std::allocator<double>_> p;
  double *local_158;
  double *pdStack_150;
  double *local_148;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> local_138;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> local_120;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> local_108;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> local_f0;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> local_d8;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> local_c0;
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  local_a8;
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  local_80;
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  local_58;
  
  local_158 = (double *)0x0;
  pdStack_150 = (double *)0x0;
  local_148 = (double *)0x0;
  local_158 = (double *)operator_new(0x18);
  pdStack_150 = local_158 + 3;
  *local_158 = 0.0;
  local_158[1] = 0.0;
  local_158[2] = 0.0;
  *local_158 = 4.0;
  local_158[1] = 6.0;
  local_158[2] = 8.0;
  local_148 = pdStack_150;
  poVar1 = viennamath::operator<<((ostream *)&std::cout,e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," at STL (",9);
  poVar1 = std::ostream::_M_insert<double>(*local_158);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>(local_158[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>(local_158[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
  (*(e->super_rt_expression_interface<double>)._vptr_rt_expression_interface[5])(e,&local_158);
  poVar1 = std::ostream::_M_insert<double>(extraout_XMM0_Qa);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
  viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::rt_unary_expr
            (&local_c0,e);
  (*local_c0.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])
            (&local_c0,&local_158);
  poVar1 = std::ostream::_M_insert<double>(extraout_XMM0_Qa_00);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (reference solution: ",0x16);
  poVar1 = std::ostream::_M_insert<double>(ref_solution);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_c0.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_001302e0;
  if (local_c0.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_c0.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_c0.expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_c0.expr_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::rt_unary_expr
            (&local_d8,e);
  (*local_d8.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])
            (&local_d8,&local_158);
  if (ref_solution <= extraout_XMM0_Qa_01) {
    viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::rt_unary_expr
              (&local_f0,e);
    (*local_f0.super_rt_expression_interface<double>._vptr_rt_expression_interface[5])
              (&local_f0,&local_158);
    if (extraout_XMM0_Qa_02 <= ref_solution) {
      local_f0.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_unary_expr_001302e0;
      if (local_f0.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0)
      {
        (*(local_f0.op_._M_ptr)->_vptr_op_interface[1])();
      }
      if (local_f0.expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
        (*(local_f0.expr_._M_ptr)->_vptr_rt_expression_interface[1])();
      }
      local_d8.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_unary_expr_001302e0;
      if (local_d8.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0)
      {
        (*(local_d8.op_._M_ptr)->_vptr_op_interface[1])();
      }
      if (local_d8.expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
        (*(local_d8.expr_._M_ptr)->_vptr_rt_expression_interface[1])();
      }
      poVar1 = viennamath::operator<<((ostream *)&std::cout,e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," at vector_3 (",0xe);
      local_80.t0_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_001303a0;
      local_80.t0_.s = 4.0;
      local_80.t1_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_00130460;
      local_80.t1_.s = 6;
      poVar1 = viennamath::operator<<(poVar1,&local_80);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
      local_a8.t0_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_001303a0;
      local_a8.t0_.s = 4.0;
      local_a8.t1_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_00130460;
      local_a8.t1_.s = 6;
      nVar2 = viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>::operator()
                        ((rt_unary_expr<viennamath::rt_expression_interface<double>> *)e,&local_a8);
      poVar1 = std::ostream::_M_insert<double>(nVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
      viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::rt_unary_expr
                (&local_108,e);
      local_58.t0_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_001303a0;
      local_58.t0_.s = 4.0;
      local_58.t1_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_00130460;
      local_58.t1_.s = 6;
      nVar2 = viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>::operator()
                        ((rt_unary_expr<viennamath::rt_expression_interface<double>> *)&local_108,
                         &local_58);
      poVar1 = std::ostream::_M_insert<double>(nVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," (reference solution: ",0x16);
      poVar1 = std::ostream::_M_insert<double>(ref_solution);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      local_108.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_unary_expr_001302e0;
      if (local_108.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0)
      {
        (*(local_108.op_._M_ptr)->_vptr_op_interface[1])();
      }
      if (local_108.expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
        (*(local_108.expr_._M_ptr)->_vptr_rt_expression_interface[1])();
      }
      viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::rt_unary_expr
                (&local_120,e);
      local_80.t0_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_001303a0;
      local_80.t0_.s = 4.0;
      local_80.t1_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_expression_interface_00130460;
      local_80.t1_.s = 6;
      nVar2 = viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>::operator()
                        ((rt_unary_expr<viennamath::rt_expression_interface<double>> *)&local_120,
                         &local_80);
      if (nVar2 <= ref_solution) {
        viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::rt_unary_expr
                  (&local_138,e);
        local_a8.t0_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
             (_func_int **)&PTR__rt_expression_interface_001303a0;
        local_a8.t0_.s = 4.0;
        local_a8.t1_.super_rt_expression_interface<double>._vptr_rt_expression_interface =
             (_func_int **)&PTR__rt_expression_interface_00130460;
        local_a8.t1_.s = 6;
        nVar2 = viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>>::operator()
                          ((rt_unary_expr<viennamath::rt_expression_interface<double>> *)&local_138,
                           &local_a8);
        if (ref_solution <= nVar2) {
          local_138.super_rt_expression_interface<double>._vptr_rt_expression_interface =
               (_func_int **)&PTR__rt_unary_expr_001302e0;
          if (local_138.op_._M_ptr !=
              (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
            (*(local_138.op_._M_ptr)->_vptr_op_interface[1])();
          }
          if (local_138.expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
            (*(local_138.expr_._M_ptr)->_vptr_rt_expression_interface[1])();
          }
          local_120.super_rt_expression_interface<double>._vptr_rt_expression_interface =
               (_func_int **)&PTR__rt_unary_expr_001302e0;
          if (local_120.op_._M_ptr !=
              (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
            (*(local_120.op_._M_ptr)->_vptr_op_interface[1])();
          }
          if (local_120.expr_._M_ptr != (rt_expression_interface<double> *)0x0) {
            (*(local_120.expr_._M_ptr)->_vptr_rt_expression_interface[1])();
          }
          if (local_158 != (double *)0x0) {
            operator_delete(local_158,(long)local_148 - (long)local_158);
          }
          return;
        }
      }
      __assert_fail("viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) <= ref_solution && viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) >= ref_solution"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/viennamath[P]viennamath-dev/tests/src/runtime_test.cpp"
                    ,0x66,"void unary_test(const E &, double) [E = viennamath::rt_unary_expr<>]");
    }
  }
  __assert_fail("viennamath::eval(e, p) >= ref_solution && viennamath::eval(e, p) <= ref_solution",
                "/workspace/llm4binary/github/license_all_cmakelists_25/viennamath[P]viennamath-dev/tests/src/runtime_test.cpp"
                ,0x60,"void unary_test(const E &, double) [E = viennamath::rt_unary_expr<>]");
}

Assistant:

void unary_test(E const & e, double ref_solution)
{
  viennamath::rt_constant<double> c4(4.0);
  viennamath::rt_constant<long> c6(6);
  viennamath::ct_constant<8> c8;

  std::vector<double> p(3);
  p[0] = 4;
  p[1] = 6;
  p[2] = 8;

  std::cout << e << " at STL (" << p[0] << ", " << p[1] << ", " << p[2] << ")"
            << " = " << e(p)
            << " = " << viennamath::eval(e,p)
            << " (reference solution: " << ref_solution << ")" << std::endl;
  assert(viennamath::eval(e, p) >= ref_solution && viennamath::eval(e, p) <= ref_solution);

  std::cout << e << " at vector_3 (" << viennamath::make_vector(c4, c6, c8) << ")"
            << " = " << e(viennamath::make_vector(c4, c6, c8))
            << " = " << viennamath::eval(e, viennamath::make_vector(c4, c6, c8))
            << " (reference solution: " << ref_solution << ")" << std::endl;
  assert(viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) <= ref_solution && viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) >= ref_solution);
}